

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicAttachment::addTransformation
          (KinematicAttachment *this,Transformation *transformation)

{
  value_type *in_RDI;
  vector<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_> *unaff_retaddr;
  
  std::vector<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addTransformation( COLLADAFW::Transformation* transformation ) { mTransformations.push_back(transformation); }